

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,uint64_t *value)

{
  int *piVar1;
  char cVar2;
  StreamReader *pSVar3;
  bool bVar4;
  size_type sVar5;
  bool bVar6;
  type_conflict2 tVar7;
  ulong uVar8;
  char *pcVar9;
  int retcode;
  char c;
  stringstream ss;
  uint local_21c;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  bVar6 = Char1(this,(char *)&local_21c);
  if (bVar6) {
    piVar1 = &(this->_curr_cursor).col;
    *piVar1 = *piVar1 + 1;
    if ((local_21c & 0xff) == 0x2b) {
      bVar6 = false;
      bVar4 = true;
LAB_0031eaf5:
      ::std::operator<<(local_1a8,(char)local_21c);
      if (!bVar6) {
        while( true ) {
          bVar6 = Eof(this);
          if (bVar6) break;
          bVar6 = Char1(this,(char *)&local_218);
          if (!bVar6) goto LAB_0031ebd2;
          if (9 < (byte)((char)local_218._M_dataplus._M_p - 0x30U)) {
            pSVar3 = this->_sr;
            if ((0 < (long)pSVar3->idx_) && (uVar8 = pSVar3->idx_ - 1, uVar8 <= pSVar3->length_)) {
              pSVar3->idx_ = uVar8;
            }
            break;
          }
          ::std::operator<<(local_1a8,(char)local_218._M_dataplus._M_p);
        }
        if (bVar4) {
          ::std::__cxx11::stringbuf::str();
          sVar5 = local_218._M_string_length;
          ::std::__cxx11::string::_M_dispose();
          if (sVar5 == 1) {
            pcVar9 = "Integer value expected but got sign character only.\n";
            goto LAB_0031eb11;
          }
        }
        ::std::__cxx11::stringbuf::str();
        if (local_218._M_string_length < 2) {
          ::std::__cxx11::string::_M_dispose();
        }
        else {
          ::std::__cxx11::stringbuf::str();
          cVar2 = *local_1f8._M_dataplus._M_p;
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (cVar2 == '0') {
            pcVar9 = "Zero padded integer value is not allowed.\n";
            goto LAB_0031eb11;
          }
        }
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::stringbuf::str();
        tVar7 = jsteemann::atoi<unsigned_long>
                          ((char *)CONCAT71(local_218._M_dataplus._M_p._1_7_,
                                            (char)local_218._M_dataplus._M_p),
                           local_1f8._M_dataplus._M_p + local_1d8._M_string_length,(int *)&local_21c
                          );
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        bVar6 = local_21c == 0;
        if (bVar6) {
          *value = tVar7;
        }
        else {
          if (local_21c == 0xfffffffd) {
            pcVar9 = "Integer value overflows.\n";
          }
          else if (local_21c == 0xfffffffe) {
            pcVar9 = "Negative sign `-` specified for uint32 integer.\n";
          }
          else if (local_21c == 0xffffffff) {
            pcVar9 = "Not an 32bit unsigned integer literal.\n";
          }
          else {
            pcVar9 = "Invalid integer literal\n";
          }
          ::std::__cxx11::string::string((string *)&local_218,pcVar9,(allocator *)&local_1f8);
          PushError(this,&local_218);
          ::std::__cxx11::string::_M_dispose();
        }
        goto LAB_0031ebd4;
      }
      pcVar9 = "Unsigned value expected but got \'-\' sign.";
LAB_0031eb11:
      ::std::__cxx11::string::string((string *)&local_218,pcVar9,(allocator *)&local_1f8);
      PushError(this,&local_218);
    }
    else {
      if ((local_21c & 0xff) == 0x2d) {
        bVar4 = true;
        bVar6 = true;
        goto LAB_0031eaf5;
      }
      if ((byte)((char)local_21c - 0x30U) < 10) {
        bVar4 = false;
        bVar6 = false;
        goto LAB_0031eaf5;
      }
      ::std::__cxx11::to_string(&local_1d8,(int)(char)local_21c);
      ::std::operator+(&local_1f8,"Sign or 0-9 expected, but got \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1d8);
      ::std::operator+(&local_218,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1f8,"\'.\n");
      PushError(this,&local_218);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::string::_M_dispose();
  }
LAB_0031ebd2:
  bVar6 = false;
LAB_0031ebd4:
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return bVar6;
}

Assistant:

bool AsciiParser::ReadBasicType(uint64_t *value) {
  std::stringstream ss;

  // head character
  bool has_sign = false;
  bool negative = false;
  {
    char sc;
    if (!Char1(&sc)) {
      return false;
    }
    _curr_cursor.col++;

    // sign or [0-9]
    if (sc == '+') {
      negative = false;
      has_sign = true;
    } else if (sc == '-') {
      negative = true;
      has_sign = true;
    } else if ((sc >= '0') && (sc <= '9')) {
      // ok
    } else {
      PushError("Sign or 0-9 expected, but got '" + std::to_string(sc) +
                "'.\n");
      return false;
    }

    ss << sc;
  }

  if (negative) {
    PushError("Unsigned value expected but got '-' sign.");
    return false;
  }

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if ((c >= '0') && (c <= '9')) {
      ss << c;
    } else {
      _sr->seek_from_current(-1);
      break;
    }
  }

  if (has_sign && (ss.str().size() == 1)) {
    // sign only
    PushError("Integer value expected but got sign character only.\n");
    return false;
  }

  if ((ss.str().size() > 1) && (ss.str()[0] == '0')) {
    PushError("Zero padded integer value is not allowed.\n");
    return false;
  }

  // std::cout << "ReadInt token: " << ss.str() << "\n";

  // TODO(syoyo): Use ryu parse.
#if defined(__cpp_exceptions) || defined(__EXCEPTIONS)
  try {
    (*value) = std::stoull(ss.str());
  } catch (const std::invalid_argument &e) {
    (void)e;
    PushError("Not an 64bit unsigned integer literal.\n");
    return false;
  } catch (const std::out_of_range &e) {
    (void)e;
    PushError("64bit unsigned integer value out of range.\n");
    return false;
  }

  return true;
#else
  // use jsteemann/atoi
  int retcode;
  auto result = jsteemann::atoi<uint64_t>(
      ss.str().c_str(), ss.str().c_str() + ss.str().size(), retcode);
  if (retcode == jsteemann::SUCCESS) {
    (*value) = result;
    return true;
  } else if (retcode == jsteemann::INVALID_INPUT) {
    PushError("Not an 32bit unsigned integer literal.\n");
    return false;
  } else if (retcode == jsteemann::INVALID_NEGATIVE_SIGN) {
    PushError("Negative sign `-` specified for uint32 integer.\n");
    return false;
  } else if (retcode == jsteemann::VALUE_OVERFLOW) {
    PushError("Integer value overflows.\n");
    return false;
  }

  PushError("Invalid integer literal\n");
  return false;
#endif

  // std::cout << "read int ok\n";
}